

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O3

void __thiscall dynamicgraph::TracerRealTime::display(TracerRealTime *this,ostream *os)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  _func_int **pp_Var5;
  char *pcVar6;
  long *plVar7;
  sbyte sVar8;
  string unit;
  long *local_70;
  char *local_68;
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  long *local_40;
  double local_38;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,CLASS_NAME_abi_cxx11_._M_dataplus._M_p,
                      CLASS_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)&this->field_0x8,*(long *)&this->field_0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," [mode=",7);
  pcVar6 = "pause";
  if ((ulong)(byte)this->field_0x1c0 != 0) {
    pcVar6 = "play";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,pcVar6,(ulong)(byte)this->field_0x1c0 ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] : ",4);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  - Dep list: ",0xe);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_50 = &this->field_0xd8;
  plVar7 = *(long **)&this->field_0xd8;
  if ((long *)local_50 != plVar7) {
    local_40 = (long *)&this->field_0x190;
    do {
      local_40 = (long *)*local_40;
      if (local_40[2] == 0) {
        lVar4 = 0;
      }
      else {
        lVar4 = __dynamic_cast(local_40[2],&std::ostream::typeinfo,&OutStringStream::typeinfo,0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"     -> ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,*(char **)(plVar7[2] + 8),*(long *)(plVar7[2] + 0x10));
      if (*(long *)(lVar4 + 0x98) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os," (in ",5);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,*(char **)(lVar4 + 0x90),*(long *)(lVar4 + 0x98));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
      local_48 = *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]);
      uVar1 = *(ulong *)(lVar4 + 0x78);
      uVar2 = *(ulong *)(lVar4 + 0x80);
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70);
      if (uVar1 < 0x40000000 && uVar2 < 0x40000000) {
        if (uVar1 < 0x100000 && uVar2 < 0x100000) {
          sVar8 = 0;
          if (0x3ff < uVar1 || 0x3ff < uVar2) {
            sVar8 = 10;
            std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x10e12a);
          }
        }
        else {
          sVar8 = 0x14;
          std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x10e127);
        }
      }
      else {
        sVar8 = 0x1e;
        std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x10e124);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
      pp_Var5 = os->_vptr_basic_ostream;
      *(undefined8 *)(&os->field_0x10 + (long)pp_Var5[-3]) = 1;
      *(undefined8 *)(&os->field_0x8 + (long)pp_Var5[-3]) = 1;
      local_38 = (double)(1 << sVar8);
      poVar3 = std::ostream::_M_insert<double>((double)(long)uVar1 / local_38);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_70,(long)local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
      *(undefined8 *)(&poVar3->field_0x8 + (long)poVar3->_vptr_basic_ostream[-3]) = 2;
      poVar3 = std::ostream::_M_insert<double>((double)(long)uVar2 / local_38);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_70,(long)local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\t",2);
      if (*(char *)(lVar4 + 0x88) == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>(os,"(FULL)",6);
      }
      pp_Var5 = os->_vptr_basic_ostream;
      *(undefined8 *)(&os->field_0x8 + (long)pp_Var5[-3]) = local_48;
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
        pp_Var5 = os->_vptr_basic_ostream;
      }
      std::ios::widen((char)pp_Var5[-3] + (char)os);
      std::ostream::put((char)os);
      std::ostream::flush();
      plVar7 = (long *)*plVar7;
    } while ((long *)local_50 != plVar7);
  }
  return;
}

Assistant:

void TracerRealTime::display(std::ostream &os) const {
  os << CLASS_NAME << " " << name << " [mode=" << (play ? "play" : "pause")
     << "] : " << endl
     << "  - Dep list: " << endl;

  FileList::const_iterator iterFile = files.begin();
  for (SignalList::const_iterator iter = toTraceSignals.begin();
       toTraceSignals.end() != iter; ++iter) {
    dgDEBUG(35) << "Next" << endl;
    const OutStringStream *file = dynamic_cast<OutStringStream *>(*iterFile);
    os << "     -> " << (*iter)->getName();
    if (file->givenname.length()) os << " (in " << file->givenname << ")";
    os << "\t";
    if (file) {
      const std::streamsize PRECISION = os.precision();
      const std::streamsize SIZE = file->index;
      const std::streamsize MSIZE = file->bufferSize;
      unsigned int dec = 0;
      std::string unit = "";
      if ((SIZE >> 30) || (MSIZE >> 30)) {
        dec = 30;
        unit = "Go";
      } else if ((SIZE >> 20) || (MSIZE >> 20)) {
        dec = 20;
        unit = "Mo";
      } else if ((SIZE >> 10) || (MSIZE >> 10)) {
        dec = 10;
        unit = "Ko";
      }
      os << "[" << std::setw(1) << std::setprecision(1)
         << (((double)SIZE + 0.0) / (1 << dec)) << unit << "/"
         << std::setprecision(2) << (((double)MSIZE + 0.0) / (1 << dec)) << unit
         << "]\t";
      if (file->full) os << "(FULL)";
      os.precision(PRECISION);
    }
    os << endl;
    ++iterFile;
  }
}